

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setMaximumDateTime(QDateTimeEdit *this,QDateTime *dt)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  QDateTime *pQVar5;
  long in_FS_OFFSET;
  QDateTime min;
  QDateTime m;
  QVariant local_70;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  cVar2 = QDateTime::isValid();
  if (cVar2 != '\0') {
    lVar4 = QDateTime::date();
    QDate::QDate((QDate *)&local_50.shared,9999,0xc,0x1f);
    if (lVar4 <= (long)local_50.shared) {
      _m = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::toTimeZone((QTimeZone *)&m);
      _min = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toDateTime();
      bVar3 = ::operator<(&min,&m);
      pQVar5 = &m;
      if (bVar3) {
        pQVar5 = &min;
      }
      ::QVariant::QVariant((QVariant *)&local_50,pQVar5);
      ::QVariant::QVariant(&local_70,&m);
      (**(code **)(*plVar1 + 0xb0))(plVar1,&local_50,&local_70);
      ::QVariant::~QVariant(&local_70);
      ::QVariant::~QVariant((QVariant *)&local_50);
      QDateTime::~QDateTime(&min);
      QDateTime::~QDateTime(&m);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setMaximumDateTime(const QDateTime &dt)
{
    Q_D(QDateTimeEdit);
    if (dt.isValid() && dt.date() <= QDATETIMEEDIT_DATE_MAX) {
        const QDateTime m = dt.toTimeZone(d->timeZone);
        const QDateTime min = d->minimum.toDateTime();
        d->setRange((min < m ? min : m), m);
    }
}